

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ConfigParse
              (Fts5Global *pGlobal,sqlite3 *db,int nArg,char **azArg,Fts5Config **ppOut,char **pzErr
              )

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  char *local_c0;
  char *local_98;
  char *zTail;
  int local_88;
  int bDummy;
  int bMustBeCol;
  int bOption;
  char *zTwo;
  char *zOne;
  char *z;
  char *zOrig;
  sqlite3_int64 nByte;
  Fts5Config *pFStack_50;
  int i;
  Fts5Config *pRet;
  char **ppcStack_40;
  int rc;
  char **pzErr_local;
  Fts5Config **ppOut_local;
  char **azArg_local;
  sqlite3 *psStack_20;
  int nArg_local;
  sqlite3 *db_local;
  Fts5Global *pGlobal_local;
  
  pRet._4_4_ = 0;
  ppcStack_40 = pzErr;
  pzErr_local = (char **)ppOut;
  ppOut_local = (Fts5Config **)azArg;
  azArg_local._4_4_ = nArg;
  psStack_20 = db;
  db_local = (sqlite3 *)pGlobal;
  pFStack_50 = (Fts5Config *)sqlite3_malloc(0xa8);
  *pzErr_local = (char *)pFStack_50;
  if (pFStack_50 == (Fts5Config *)0x0) {
    pGlobal_local._4_4_ = 7;
  }
  else {
    memset(pFStack_50,0,0xa8);
    pFStack_50->db = psStack_20;
    pFStack_50->iCookie = -1;
    zOrig = (char *)((long)azArg_local._4_4_ * 9);
    ppcVar2 = (char **)sqlite3Fts5MallocZero((int *)((long)&pRet + 4),(sqlite3_int64)zOrig);
    pFStack_50->azCol = ppcVar2;
    pFStack_50->abUnindexed = (u8 *)(pFStack_50->azCol + azArg_local._4_4_);
    pcVar3 = sqlite3Fts5Strndup((int *)((long)&pRet + 4),(char *)ppOut_local[1],-1);
    pFStack_50->zDb = pcVar3;
    pcVar3 = sqlite3Fts5Strndup((int *)((long)&pRet + 4),(char *)ppOut_local[2],-1);
    pFStack_50->zName = pcVar3;
    pFStack_50->bColumnsize = 1;
    pFStack_50->eDetail = 0;
    if ((pRet._4_4_ == 0) && (iVar1 = sqlite3_stricmp(pFStack_50->zName,"rank"), iVar1 == 0)) {
      pcVar3 = sqlite3_mprintf("reserved fts5 table name: %s",pFStack_50->zName);
      *ppcStack_40 = pcVar3;
      pRet._4_4_ = 1;
    }
    for (nByte._4_4_ = 3; pRet._4_4_ == 0 && nByte._4_4_ < azArg_local._4_4_;
        nByte._4_4_ = nByte._4_4_ + 1) {
      z = (char *)ppOut_local[nByte._4_4_];
      zTwo = (char *)0x0;
      _bMustBeCol = (char *)0x0;
      bDummy = 0;
      local_88 = 0;
      zOne = fts5ConfigGobbleWord((int *)((long)&pRet + 4),z,&zTwo,&local_88);
      zOne = fts5ConfigSkipWhitespace(zOne);
      if ((zOne != (char *)0x0) && (*zOne == '=')) {
        bDummy = 1;
        zOne = zOne + 1;
        if (local_88 != 0) {
          zOne = (char *)0x0;
        }
      }
      zOne = fts5ConfigSkipWhitespace(zOne);
      if ((((zOne != (char *)0x0) && (*zOne != '\0')) &&
          (zOne = fts5ConfigGobbleWord
                            ((int *)((long)&pRet + 4),zOne,(char **)&bMustBeCol,
                             (int *)((long)&zTail + 4)), zOne != (char *)0x0)) && (*zOne != '\0')) {
        zOne = (char *)0x0;
      }
      if (pRet._4_4_ == 0) {
        if (zOne == (char *)0x0) {
          pcVar3 = sqlite3_mprintf("parse error in \"%s\"",z);
          *ppcStack_40 = pcVar3;
          pRet._4_4_ = 1;
        }
        else if (bDummy == 0) {
          pRet._4_4_ = fts5ConfigParseColumn(pFStack_50,zTwo,_bMustBeCol,ppcStack_40);
          zTwo = (char *)0x0;
        }
        else {
          if (_bMustBeCol == (char *)0x0) {
            local_c0 = "";
          }
          else {
            local_c0 = _bMustBeCol;
          }
          pRet._4_4_ = fts5ConfigParseSpecial
                                 ((Fts5Global *)db_local,pFStack_50,zTwo,local_c0,ppcStack_40);
        }
      }
      sqlite3_free(zTwo);
      sqlite3_free(_bMustBeCol);
    }
    if ((pRet._4_4_ == 0) && (pFStack_50->pTok == (Fts5Tokenizer *)0x0)) {
      pRet._4_4_ = fts5ConfigDefaultTokenizer((Fts5Global *)db_local,pFStack_50);
    }
    if ((pRet._4_4_ == 0) && (pFStack_50->zContent == (char *)0x0)) {
      local_98 = (char *)0x0;
      if (pFStack_50->eContent == 0) {
        local_98 = "content";
      }
      else if (pFStack_50->bColumnsize != 0) {
        local_98 = "docsize";
      }
      if (local_98 != (char *)0x0) {
        pcVar3 = sqlite3Fts5Mprintf((int *)((long)&pRet + 4),"%Q.\'%q_%s\'",pFStack_50->zDb,
                                    pFStack_50->zName,local_98);
        pFStack_50->zContent = pcVar3;
      }
    }
    if ((pRet._4_4_ == 0) && (pFStack_50->zContentRowid == (char *)0x0)) {
      pcVar3 = sqlite3Fts5Strndup((int *)((long)&pRet + 4),"rowid",-1);
      pFStack_50->zContentRowid = pcVar3;
    }
    if (pRet._4_4_ == 0) {
      pRet._4_4_ = fts5ConfigMakeExprlist(pFStack_50);
    }
    if (pRet._4_4_ != 0) {
      sqlite3Fts5ConfigFree(pFStack_50);
      *pzErr_local = (char *)0x0;
    }
    pGlobal_local._4_4_ = pRet._4_4_;
  }
  return pGlobal_local._4_4_;
}

Assistant:

static int sqlite3Fts5ConfigParse(
  Fts5Global *pGlobal,
  sqlite3 *db,
  int nArg,                       /* Number of arguments */
  const char **azArg,             /* Array of nArg CREATE VIRTUAL TABLE args */
  Fts5Config **ppOut,             /* OUT: Results of parse */
  char **pzErr                    /* OUT: Error message */
){
  int rc = SQLITE_OK;             /* Return code */
  Fts5Config *pRet;               /* New object to return */
  int i;
  sqlite3_int64 nByte;

  *ppOut = pRet = (Fts5Config*)sqlite3_malloc(sizeof(Fts5Config));
  if( pRet==0 ) return SQLITE_NOMEM;
  memset(pRet, 0, sizeof(Fts5Config));
  pRet->db = db;
  pRet->iCookie = -1;

  nByte = nArg * (sizeof(char*) + sizeof(u8));
  pRet->azCol = (char**)sqlite3Fts5MallocZero(&rc, nByte);
  pRet->abUnindexed = (u8*)&pRet->azCol[nArg];
  pRet->zDb = sqlite3Fts5Strndup(&rc, azArg[1], -1);
  pRet->zName = sqlite3Fts5Strndup(&rc, azArg[2], -1);
  pRet->bColumnsize = 1;
  pRet->eDetail = FTS5_DETAIL_FULL;
#ifdef SQLITE_DEBUG
  pRet->bPrefixIndex = 1;
#endif
  if( rc==SQLITE_OK && sqlite3_stricmp(pRet->zName, FTS5_RANK_NAME)==0 ){
    *pzErr = sqlite3_mprintf("reserved fts5 table name: %s", pRet->zName);
    rc = SQLITE_ERROR;
  }

  for(i=3; rc==SQLITE_OK && i<nArg; i++){
    const char *zOrig = azArg[i];
    const char *z;
    char *zOne = 0;
    char *zTwo = 0;
    int bOption = 0;
    int bMustBeCol = 0;

    z = fts5ConfigGobbleWord(&rc, zOrig, &zOne, &bMustBeCol);
    z = fts5ConfigSkipWhitespace(z);
    if( z && *z=='=' ){
      bOption = 1;
      z++;
      if( bMustBeCol ) z = 0;
    }
    z = fts5ConfigSkipWhitespace(z);
    if( z && z[0] ){
      int bDummy;
      z = fts5ConfigGobbleWord(&rc, z, &zTwo, &bDummy);
      if( z && z[0] ) z = 0;
    }

    if( rc==SQLITE_OK ){
      if( z==0 ){
        *pzErr = sqlite3_mprintf("parse error in \"%s\"", zOrig);
        rc = SQLITE_ERROR;
      }else{
        if( bOption ){
          rc = fts5ConfigParseSpecial(pGlobal, pRet, zOne, zTwo?zTwo:"", pzErr);
        }else{
          rc = fts5ConfigParseColumn(pRet, zOne, zTwo, pzErr);
          zOne = 0;
        }
      }
    }

    sqlite3_free(zOne);
    sqlite3_free(zTwo);
  }

  /* If a tokenizer= option was successfully parsed, the tokenizer has
  ** already been allocated. Otherwise, allocate an instance of the default
  ** tokenizer (unicode61) now.  */
  if( rc==SQLITE_OK && pRet->pTok==0 ){
    rc = fts5ConfigDefaultTokenizer(pGlobal, pRet);
  }

  /* If no zContent option was specified, fill in the default values. */
  if( rc==SQLITE_OK && pRet->zContent==0 ){
    const char *zTail = 0;
    assert( pRet->eContent==FTS5_CONTENT_NORMAL 
         || pRet->eContent==FTS5_CONTENT_NONE 
    );
    if( pRet->eContent==FTS5_CONTENT_NORMAL ){
      zTail = "content";
    }else if( pRet->bColumnsize ){
      zTail = "docsize";
    }

    if( zTail ){
      pRet->zContent = sqlite3Fts5Mprintf(
          &rc, "%Q.'%q_%s'", pRet->zDb, pRet->zName, zTail
      );
    }
  }

  if( rc==SQLITE_OK && pRet->zContentRowid==0 ){
    pRet->zContentRowid = sqlite3Fts5Strndup(&rc, "rowid", -1);
  }

  /* Formulate the zContentExprlist text */
  if( rc==SQLITE_OK ){
    rc = fts5ConfigMakeExprlist(pRet);
  }

  if( rc!=SQLITE_OK ){
    sqlite3Fts5ConfigFree(pRet);
    *ppOut = 0;
  }
  return rc;
}